

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printTree(Node *node,int space)

{
  bool bVar1;
  ostream *poVar2;
  Node local_80;
  reference local_40;
  Node *n;
  iterator __end1;
  iterator __begin1;
  vector<Node,_std::allocator<Node>_> *__range1;
  int local_18;
  int local_14;
  int i;
  int space_local;
  Node *node_local;
  
  local_14 = space;
  _i = node;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  __range1._4_4_ = Node::getKind(node);
  poVar2 = operator<<((ostream *)&std::cout,(nodekind *)((long)&__range1 + 4));
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&node->value);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Node,_std::allocator<Node>_>::begin(&node->subnodes);
  n = (Node *)std::vector<Node,_std::allocator<Node>_>::end(&node->subnodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>
                                *)&n);
    if (!bVar1) break;
    local_40 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
               operator*(&__end1);
    Node::Node(&local_80,local_40);
    printTree(&local_80,local_14 + 5);
    Node::~Node(&local_80);
    __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void printTree(Node node, int space) {
    for (int i = 0; i < space; i++) {
        cout << " ";
    }
    cout << node.getKind() << " " << node.value << endl;
    for (const auto &n : node.subnodes) {
        printTree(n, space + 5);
    }
}